

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

int __thiscall
capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
          (PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *this,EVP_PKEY_CTX *ctx)

{
  StructSchema schema;
  StructSchema SVar1;
  StructSize size;
  undefined7 in_stack_ffffffffffffffa8;
  DebugExpression<bool> in_stack_ffffffffffffffaf;
  StructSchema schema_local;
  Fault f;
  void *local_38;
  uint local_28;
  
  schema_local.super_Schema.raw = (Schema)(Schema)ctx;
  Schema::getProto((Reader *)&f,&schema_local.super_Schema);
  SVar1.super_Schema.raw = schema_local.super_Schema.raw;
  if ((0xe0 < local_28) &&
     (in_stack_ffffffffffffffaf.value = (bool)(*(byte *)((long)local_38 + 0x1c) & 1 ^ 1),
     (*(byte *)((long)local_38 + 0x1c) & 1) != 0)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x783,FAILED,"!schema.getProto().getStruct().getIsGroup()",
               "_kjCondition,\"Cannot form pointer to group type.\"",
               (DebugExpression<bool> *)&stack0xffffffffffffffaf,
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal(&f);
  }
  schema.super_Schema.raw._7_1_ = in_stack_ffffffffffffffaf.value;
  schema.super_Schema.raw._0_7_ = in_stack_ffffffffffffffa8;
  size = anon_unknown_71::structSizeFromSchema(schema);
  PointerBuilder::initStruct((StructBuilder *)(this + 8),(PointerBuilder *)&stack0x00000008,size);
  *(Schema *)this = SVar1.super_Schema.raw;
  return (int)this;
}

Assistant:

DynamicStruct::Builder PointerHelpers<DynamicStruct, Kind::OTHER>::init(
    PointerBuilder builder, StructSchema schema) {
  KJ_REQUIRE(!schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  return DynamicStruct::Builder(schema,
      builder.initStruct(structSizeFromSchema(schema)));
}